

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O1

CAmount wallet::coinselector_tests::make_hard_case
                  (int utxos,vector<wallet::COutput,_std::allocator<wallet::COutput>_> *utxo_pool)

{
  long lVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  CAmount CVar6;
  long in_FS_OFFSET;
  long local_40;
  long local_38;
  
  uVar5 = (ulong)(uint)utxos;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>::_M_erase_at_end
            (utxo_pool,
             (utxo_pool->super__Vector_base<wallet::COutput,_std::allocator<wallet::COutput>_>).
             _M_impl.super__Vector_impl_data._M_start);
  if (utxos < 1) {
    CVar6 = 0;
  }
  else {
    iVar2 = utxos + -1;
    lVar1 = uVar5 * 2;
    lVar3 = 0;
    CVar6 = 0;
    do {
      lVar4 = 1L << ((byte)uVar5 & 0x3f);
      CVar6 = CVar6 + lVar4;
      local_40 = lVar4;
      add_coin(&local_40,(int)lVar3,utxo_pool);
      local_40 = (1L << ((byte)iVar2 & 0x3f)) + lVar4;
      add_coin(&local_40,(int)lVar3 + 1,utxo_pool);
      uVar5 = uVar5 + 1;
      lVar3 = lVar3 + 2;
      iVar2 = iVar2 + -1;
    } while (lVar1 != lVar3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return CVar6;
}

Assistant:

static CAmount make_hard_case(int utxos, std::vector<COutput>& utxo_pool)
{
    utxo_pool.clear();
    CAmount target = 0;
    for (int i = 0; i < utxos; ++i) {
        target += CAmount{1} << (utxos+i);
        add_coin(CAmount{1} << (utxos+i), 2*i, utxo_pool);
        add_coin((CAmount{1} << (utxos+i)) + (CAmount{1} << (utxos-1-i)), 2*i + 1, utxo_pool);
    }
    return target;
}